

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O0

LispPTR UFS_getfilename(LispPTR *args)

{
  int iVar1;
  LispPTR *pLVar2;
  LispPTR *pLVar3;
  DLword *pDVar4;
  int *piVar5;
  size_t x;
  bool bVar6;
  LispPTR local_20b0;
  ulong local_20a8;
  size_t lf_i_1;
  char *lf_dptr_1;
  char *lf_sptr_1;
  LispPTR *lf_naddress;
  size_t lf_ii;
  size_t lf_i;
  char *lf_dptr;
  char *lf_sptr;
  size_t lf_length;
  short *lf_sbase;
  char *lf_dp;
  char *lf_base;
  OneDArray *lf_arrayp_1;
  OneDArray *lf_arrayp;
  char file [4096];
  char lfname [4096];
  long lStack_28;
  int rval;
  size_t len;
  char *base;
  LispPTR *args_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);
    pLVar2 = NativeAligned4FromLAddr(*args);
    if (*(char *)((long)pLVar2 + 6) == 'C') {
      lStack_28 = (long)(int)pLVar2[2];
    }
    else if (*(char *)((long)pLVar2 + 6) == 'D') {
      lStack_28 = (long)(int)(pLVar2[2] << 1);
    }
    else {
      error("LispStringLength: Not a character array.\n");
    }
    if (lStack_28 + 1U < 0x1001) {
      pLVar2 = NativeAligned4FromLAddr(*args);
      if ((int)pLVar2[2] < 0x1000) {
        local_20b0 = pLVar2[2];
      }
      else {
        local_20b0 = 0x1000;
      }
      pLVar3 = (LispPTR *)(long)(int)local_20b0;
      if (*(char *)((long)pLVar2 + 6) == 'C') {
        pDVar4 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
        lf_i = (size_t)(file + 0xff8);
        lf_dptr = (char *)((long)pDVar4 + (long)(int)(uint)(ushort)pLVar2[1]);
        for (lf_ii = 0; lf_ii < pLVar3; lf_ii = lf_ii + 1) {
          *(undefined1 *)lf_i = *(undefined1 *)((ulong)lf_dptr ^ 3);
          lf_i = lf_i + 1;
          lf_dptr = lf_dptr + 1;
        }
        (file + 0xff8)[(long)pLVar3] = '\0';
      }
      else if (*(char *)((long)pLVar2 + 6) == 'D') {
        pDVar4 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
        lf_length = (size_t)(pDVar4 + (int)(uint)(ushort)pLVar2[1]);
        lf_sbase = (short *)(file + 0xff8);
        for (lf_naddress = (LispPTR *)0x0; lf_naddress < pLVar3;
            lf_naddress = (LispPTR *)((long)lf_naddress + 1)) {
          *(char *)lf_sbase = (char)*(undefined2 *)(lf_length ^ 2);
          lf_length = lf_length + 2;
          lf_sbase = (short *)((long)lf_sbase + 1);
        }
        *(undefined1 *)lf_sbase = 0;
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      iVar1 = unixpathname(file + 0xff8,(char *)&lf_arrayp,0,0);
      if (iVar1 == 0) {
        args_local._4_4_ = 0;
      }
      else {
        if (args[1] - 0xe0000 < 2) {
          alarm(TIMEOUT_TIME);
          do {
            piVar5 = __errno_location();
            *piVar5 = 0;
            iVar1 = access((char *)&lf_arrayp,0);
            bVar6 = false;
            if (iVar1 == -1) {
              piVar5 = __errno_location();
              bVar6 = *piVar5 == 4;
            }
          } while (bVar6);
          alarm(0);
          if (iVar1 == -1) {
            piVar5 = __errno_location();
            *Lisp_errno = *piVar5;
            return 0;
          }
        }
        iVar1 = lisppathname((char *)&lf_arrayp,file + 0xff8,0,0);
        if (iVar1 == 0) {
          args_local._4_4_ = 0;
        }
        else {
          pLVar2 = NativeAligned4FromLAddr(args[2]);
          lf_i_1 = (size_t)NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
          x = strlen(file + 0xff8);
          lf_dptr_1 = file + 0xff8;
          for (local_20a8 = 0; local_20a8 < x + 1; local_20a8 = local_20a8 + 1) {
            *(char *)(lf_i_1 ^ 3) = *lf_dptr_1;
            lf_i_1 = lf_i_1 + 1;
            lf_dptr_1 = lf_dptr_1 + 1;
          }
          args_local._4_4_ = GetSmallp(x);
        }
      }
    }
    else {
      *Lisp_errno = 200;
      args_local._4_4_ = 0;
    }
  }
  else {
    *Lisp_errno = 100;
    args_local._4_4_ = 0;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR UFS_getfilename(LispPTR *args)
{
  char *base;
  size_t len;
  int rval;
  char lfname[MAXPATHLEN], file[MAXPATHLEN];

  ERRSETJMP(NIL);
  Lisp_errno = (int *)(NativeAligned4FromLAddr(args[3]));

  LispStringLength(args[0], len, rval);
  len += 1; /* Add 1 for terminating NULL char. */
  if (len > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);
/*
 * Convert a Lisp file name to UNIX one.  This is a UNIX device method.
 * Thus we don't need to convert a version field.  Third argument for
 * unixpathname specifies it.
 */
#ifdef DOS
  if (unixpathname(lfname, file, 0, 0, 0, 0, 0) == 0) return (NIL);
#else
  if (unixpathname(lfname, file, 0, 0) == 0) return (NIL);
#endif /* DOS */

  switch (args[1]) {
    case RECOG_OLD:
    case RECOG_OLDEST:
      /*
       * "Old" and "Oldest" means the "existing" file.  All we have to do
       * is to make sure it is an existing file or not.
       */
      TIMEOUT(rval = access(file, F_OK));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (NIL);
      }
      break;

    case RECOG_NEW:
    case RECOG_OLD_NEW:
    case RECOG_NON:
      /*
       * "New" file means the "not existing" file.  UNIX device always
       * recognizes a not existing file as if, the subsequent OPENFILE will
       * find the truth.
       * "Non" recognition is used to recognize a sysout file.
       */
      break;
  }
  /*
   * Now, we convert a file name back to Lisp format.  The version field have not
   * to be converted.  The fourth argument for lisppathname specifies it.
   */
  if (lisppathname(file, lfname, 0, 0) == 0) return (NIL);

  STRING_BASE(args[2], base);
  len = strlen(lfname);

#ifndef BYTESWAP
  strncpy(base, lfname, len + 1);
#else
  StrNCpyFromCToLisp(base, lfname, len + 1);
#endif /* BYTESWAP */

  return (GetSmallp(len));
}